

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ModifyRepeatedFieldsViaReflection
          (ReflectionTester *this,Message *message)

{
  Message *pMVar1;
  Reflection *this_00;
  FieldDescriptor *pFVar2;
  Reflection *pRVar3;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Message *local_28;
  Message *sub_message;
  Reflection *reflection;
  Message *message_local;
  ReflectionTester *this_local;
  
  reflection = (Reflection *)message;
  message_local = (Message *)this;
  this_00 = Message::GetReflection(message);
  pRVar3 = reflection;
  sub_message = (Message *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"repeated_int32",&local_49)
  ;
  pFVar2 = F(this,&local_48);
  Reflection::SetRepeatedInt32(this_00,(Message *)pRVar3,pFVar2,1,0x1f5);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"repeated_int64",&local_81)
  ;
  pFVar2 = F(this,&local_80);
  Reflection::SetRepeatedInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1f6);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"repeated_uint32",&local_a9);
  pFVar2 = F(this,&local_a8);
  Reflection::SetRepeatedUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1f7);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"repeated_uint64",&local_d1);
  pFVar2 = F(this,&local_d0);
  Reflection::SetRepeatedUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"repeated_sint32",&local_f9);
  pFVar2 = F(this,&local_f8);
  Reflection::SetRepeatedInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1f9);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"repeated_sint64",&local_121);
  pFVar2 = F(this,&local_120);
  Reflection::SetRepeatedInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1fa);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"repeated_fixed32",&local_149);
  pFVar2 = F(this,&local_148);
  Reflection::SetRepeatedUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1fb);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"repeated_fixed64",&local_171);
  pFVar2 = F(this,&local_170);
  Reflection::SetRepeatedUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1fc);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"repeated_sfixed32",&local_199);
  pFVar2 = F(this,&local_198);
  Reflection::SetRepeatedInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1fd);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"repeated_sfixed64",&local_1c1);
  pFVar2 = F(this,&local_1c0);
  Reflection::SetRepeatedInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,0x1fe);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"repeated_float",&local_1e9);
  pFVar2 = F(this,&local_1e8);
  Reflection::SetRepeatedFloat((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,511.0);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"repeated_double",&local_211);
  pFVar2 = F(this,&local_210);
  Reflection::SetRepeatedDouble((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,512.0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"repeated_bool",&local_239);
  pFVar2 = F(this,&local_238);
  Reflection::SetRepeatedBool((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,true);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"repeated_string",&local_261);
  pFVar2 = F(this,&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"515",&local_289);
  Reflection::SetRepeatedString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"repeated_bytes",&local_2b1);
  pFVar2 = F(this,&local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"516",&local_2d9);
  Reflection::SetRepeatedString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"repeatedgroup",&local_301);
  pFVar2 = F(this,&local_300);
  local_28 = Reflection::MutableRepeatedMessage((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->repeated_group_a_,0x205);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"repeated_nested_message",&local_329);
  pFVar2 = F(this,&local_328);
  local_28 = Reflection::MutableRepeatedMessage((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0x206);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"repeated_foreign_message",&local_351);
  pFVar2 = F(this,&local_350);
  local_28 = Reflection::MutableRepeatedMessage((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->foreign_c_,0x207);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"repeated_import_message",&local_379);
  pFVar2 = F(this,&local_378);
  local_28 = Reflection::MutableRepeatedMessage((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->import_d_,0x208);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"repeated_lazy_message",&local_3a1);
  pFVar2 = F(this,&local_3a0);
  local_28 = Reflection::MutableRepeatedMessage((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0x20f);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"repeated_nested_enum",&local_3c9);
  pFVar2 = F(this,&local_3c8);
  Reflection::SetRepeatedEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,this->nested_foo_);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"repeated_foreign_enum",&local_3f1);
  pFVar2 = F(this,&local_3f0);
  Reflection::SetRepeatedEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,this->foreign_foo_);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"repeated_import_enum",&local_419);
  pFVar2 = F(this,&local_418);
  Reflection::SetRepeatedEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,this->import_foo_);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"repeated_string_piece",&local_441);
  pFVar2 = F(this,&local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"524",&local_469);
  Reflection::SetRepeatedString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"repeated_cord",&local_491);
  pFVar2 = F(this,&local_490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"525",&local_4b9);
  Reflection::SetRepeatedString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,1,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::ModifyRepeatedFieldsViaReflection(
    Message* message) {
  const Reflection* reflection = message->GetReflection();
  Message* sub_message;

  reflection->SetRepeatedInt32(message, F("repeated_int32"), 1, 501);
  reflection->SetRepeatedInt64(message, F("repeated_int64"), 1, 502);
  reflection->SetRepeatedUInt32(message, F("repeated_uint32"), 1, 503);
  reflection->SetRepeatedUInt64(message, F("repeated_uint64"), 1, 504);
  reflection->SetRepeatedInt32(message, F("repeated_sint32"), 1, 505);
  reflection->SetRepeatedInt64(message, F("repeated_sint64"), 1, 506);
  reflection->SetRepeatedUInt32(message, F("repeated_fixed32"), 1, 507);
  reflection->SetRepeatedUInt64(message, F("repeated_fixed64"), 1, 508);
  reflection->SetRepeatedInt32(message, F("repeated_sfixed32"), 1, 509);
  reflection->SetRepeatedInt64(message, F("repeated_sfixed64"), 1, 510);
  reflection->SetRepeatedFloat(message, F("repeated_float"), 1, 511);
  reflection->SetRepeatedDouble(message, F("repeated_double"), 1, 512);
  reflection->SetRepeatedBool(message, F("repeated_bool"), 1, true);
  reflection->SetRepeatedString(message, F("repeated_string"), 1, "515");
  reflection->SetRepeatedString(message, F("repeated_bytes"), 1, "516");

  sub_message =
      reflection->MutableRepeatedMessage(message, F("repeatedgroup"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, repeated_group_a_, 517);
  sub_message = reflection->MutableRepeatedMessage(
      message, F("repeated_nested_message"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 518);
  sub_message = reflection->MutableRepeatedMessage(
      message, F("repeated_foreign_message"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, foreign_c_, 519);
  sub_message = reflection->MutableRepeatedMessage(
      message, F("repeated_import_message"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, import_d_, 520);
  sub_message = reflection->MutableRepeatedMessage(
      message, F("repeated_lazy_message"), 1);
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 527);

  reflection->SetRepeatedEnum(message, F("repeated_nested_enum"), 1,
                              nested_foo_);
  reflection->SetRepeatedEnum(message, F("repeated_foreign_enum"), 1,
                              foreign_foo_);
  reflection->SetRepeatedEnum(message, F("repeated_import_enum"), 1,
                              import_foo_);

  reflection->SetRepeatedString(message, F("repeated_string_piece"), 1, "524");
  reflection->SetRepeatedString(message, F("repeated_cord"), 1, "525");
}